

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

int CloseSDL2AudioDevice(void)

{
  SDL_bool SVar1;
  int iVar2;
  
  (*SDL20_LockAudio)();
  if ((audio_cbdata != (AudioCallbackWrapperData *)0x0) &&
     (audio_cbdata->app_callback_opened == SDL_FALSE)) {
    SVar1 = audio_cbdata->cdrom_opened;
    iVar2 = (*SDL20_UnlockAudio)();
    if (SVar1 == SDL_FALSE) {
      (*SDL20_CloseAudio)();
      (*SDL20_FreeAudioStream)(audio_cbdata->app_callback_stream);
      (*SDL20_FreeAudioStream)(audio_cbdata->cdrom_stream);
      (*SDL20_free)(audio_cbdata->mix_buffer);
      iVar2 = (*SDL20_free)(audio_cbdata);
      audio_cbdata = (AudioCallbackWrapperData *)0x0;
    }
    return iVar2;
  }
  iVar2 = (*SDL20_UnlockAudio)();
  return iVar2;
}

Assistant:

static int
CloseSDL2AudioDevice(void)
{
    SDL_bool close_sdl2_device;

    SDL20_LockAudio();
    close_sdl2_device = (audio_cbdata && !audio_cbdata->app_callback_opened && !audio_cbdata->cdrom_opened) ? SDL_TRUE : SDL_FALSE;
    SDL20_UnlockAudio();

    if (close_sdl2_device) {
        SDL20_CloseAudio();
        SDL20_FreeAudioStream(audio_cbdata->app_callback_stream);
        SDL20_FreeAudioStream(audio_cbdata->cdrom_stream);
        SDL20_free(audio_cbdata->mix_buffer);
        SDL20_free(audio_cbdata);
        audio_cbdata = NULL;
    }

    return -1;
}